

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O0

void Fra_BmcFilterImplications(Fra_Man_t *p,Fra_Bmc_t *pBmc)

{
  ulong uVar1;
  int iVar2;
  int i_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  int fComplR;
  int fComplL;
  int Right;
  int Left;
  int Imp;
  int f;
  int i;
  Aig_Obj_t *pRightF;
  Aig_Obj_t *pLeftF;
  Aig_Obj_t *pRightT;
  Aig_Obj_t *pLeftT;
  Aig_Obj_t *pRight;
  Aig_Obj_t *pLeft;
  Fra_Bmc_t *pBmc_local;
  Fra_Man_t *p_local;
  
  if (p->nFramesAll != 1) {
    __assert_fail("p->nFramesAll == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                  ,0x80,"void Fra_BmcFilterImplications(Fra_Man_t *, Fra_Bmc_t *)");
  }
  if (p->pManAig != pBmc->pAigFrames) {
    __assert_fail("p->pManAig == pBmc->pAigFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                  ,0x81,"void Fra_BmcFilterImplications(Fra_Man_t *, Fra_Bmc_t *)");
  }
  Imp = 0;
  do {
    iVar2 = Vec_IntSize(pBmc->vImps);
    if (iVar2 <= Imp) {
      Fra_ImpCompactArray(pBmc->vImps);
      return;
    }
    iVar2 = Vec_IntEntry(pBmc->vImps,Imp);
    if (iVar2 != 0) {
      i_00 = Fra_ImpLeft(iVar2);
      iVar2 = Fra_ImpRight(iVar2);
      pObj = Aig_ManObj(pBmc->pAig,i_00);
      pObj_00 = Aig_ManObj(pBmc->pAig,iVar2);
      for (Left = pBmc->nPref; Left < pBmc->nFramesAll; Left = Left + 1) {
        pAVar6 = Bmc_ObjFrames(pObj,Left);
        pAVar7 = Bmc_ObjFrames(pObj_00,Left);
        pAVar8 = Aig_Regular(pAVar6);
        pAVar8 = Fra_ObjFraig(pAVar8,0);
        pAVar9 = Aig_Regular(pAVar7);
        pAVar9 = Fra_ObjFraig(pAVar9,0);
        uVar1 = *(ulong *)&pObj->field_0x18;
        uVar3 = Aig_IsComplement(pAVar8);
        uVar4 = Aig_IsComplement(pAVar6);
        uVar4 = (uint)(uVar1 >> 3) & 1 ^ uVar3 ^ uVar4;
        uVar1 = *(ulong *)&pObj_00->field_0x18;
        uVar3 = Aig_IsComplement(pAVar9);
        uVar5 = Aig_IsComplement(pAVar7);
        uVar5 = (uint)(uVar1 >> 3) & 1 ^ uVar3 ^ uVar5;
        pAVar6 = Aig_Regular(pAVar8);
        pAVar7 = Aig_Regular(pAVar9);
        if (pAVar6 == pAVar7) {
          if (uVar4 != uVar5) {
            if (uVar4 == uVar5) {
              __assert_fail("fComplL != fComplR",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                            ,0x9c,"void Fra_BmcFilterImplications(Fra_Man_t *, Fra_Bmc_t *)");
            }
            pAVar6 = Aig_Regular(pAVar8);
            iVar2 = Aig_ObjIsConst1(pAVar6);
            if ((iVar2 == 0) || (uVar4 == 0)) {
              Vec_IntWriteEntry(pBmc->vImps,Imp,0);
              break;
            }
          }
        }
        else {
          pAVar6 = Aig_Regular(pAVar8);
          pAVar7 = Aig_Regular(pAVar9);
          iVar2 = Fra_NodesAreImp(p,pAVar6,pAVar7,uVar4,uVar5);
          if (iVar2 != 1) {
            Vec_IntWriteEntry(pBmc->vImps,Imp,0);
            break;
          }
        }
      }
    }
    Imp = Imp + 1;
  } while( true );
}

Assistant:

void Fra_BmcFilterImplications( Fra_Man_t * p, Fra_Bmc_t * pBmc )
{
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftT, * pRightT;
    Aig_Obj_t * pLeftF, * pRightF;
    int i, f, Imp, Left, Right;
    int fComplL, fComplR;
    assert( p->nFramesAll == 1 );
    assert( p->pManAig == pBmc->pAigFrames );
    Vec_IntForEachEntry( pBmc->vImps, Imp, i )
    {
        if ( Imp == 0 )
            continue;
        Left  = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        // get the corresponding nodes
        pLeft  = Aig_ManObj( pBmc->pAig, Left );
        pRight = Aig_ManObj( pBmc->pAig, Right );
        // iterate through the timeframes
        for ( f = pBmc->nPref; f < pBmc->nFramesAll; f++ )
        {
            // get timeframe nodes
            pLeftT  = Bmc_ObjFrames( pLeft, f );
            pRightT = Bmc_ObjFrames( pRight, f );
            // get the corresponding FRAIG nodes
            pLeftF  = Fra_ObjFraig( Aig_Regular(pLeftT), 0 );
            pRightF = Fra_ObjFraig( Aig_Regular(pRightT), 0 );
            // get the complemented attributes
            fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF) ^ Aig_IsComplement(pLeftT);
            fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF) ^ Aig_IsComplement(pRightT);
            // check equality
            if ( Aig_Regular(pLeftF) == Aig_Regular(pRightF) )
            {
                if ( fComplL == fComplR ) // x => x  - always true
                    continue;
                assert( fComplL != fComplR );
                // consider 4 possibilities:
                // NOT(1) => 1    or   0 => 1  - always true
                // 1 => NOT(1)    or   1 => 0  - never true
                // NOT(x) => x    or   x       - not always true
                // x => NOT(x)    or   NOT(x)  - not always true
                if ( Aig_ObjIsConst1(Aig_Regular(pLeftF)) && fComplL ) // proved implication
                    continue;
                // disproved implication
                Vec_IntWriteEntry( pBmc->vImps, i, 0 ); 
                break;
            }
            // check the implication 
            if ( Fra_NodesAreImp( p, Aig_Regular(pLeftF), Aig_Regular(pRightF), fComplL, fComplR ) != 1 )
            {
                Vec_IntWriteEntry( pBmc->vImps, i, 0 );
                break;
            }
        }
    }
    Fra_ImpCompactArray( pBmc->vImps );
}